

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O2

void mcpl_generic_fread(mcpl_generic_filehandle_t *fh,char *dest,uint64_t nbytes)

{
  uint uVar1;
  
  for (; 0x1fffffff < nbytes; nbytes = nbytes - 0x1fffffff) {
    mcpl_generic_fread(fh,dest,0x1fffffff);
    dest = dest + 0x1fffffff;
  }
  if (nbytes != 0) {
    uVar1 = mcpl_generic_fread_try(fh,dest,(uint)nbytes);
    if (uVar1 != (uint)nbytes) {
      mcpl_error("Error while reading from file");
    }
  }
  return;
}

Assistant:

void mcpl_generic_fread( mcpl_generic_filehandle_t* fh,
                         char * dest, uint64_t nbytes )
{
  MCPL_STATIC_ASSERT( sizeof(size_t) >= sizeof(uint32_t) );
  MCPL_STATIC_ASSERT( sizeof(int) >= sizeof(int32_t) );
  MCPL_STATIC_ASSERT( sizeof(z_off_t) >= sizeof(int32_t) );

  //Ensure we only call gzread/fread with requests well inside 32bit limit (even
  //signed since gzread can read at most INT_MAX).
  const uint64_t chunk_max = INT32_MAX / 4;
  while ( nbytes > chunk_max ) {
    mcpl_generic_fread( fh, dest, chunk_max );
    nbytes -= chunk_max;
    dest += chunk_max;
  }

  if ( !nbytes )
    return;

  unsigned to_read = (unsigned)nbytes;
  unsigned actually_read = mcpl_generic_fread_try( fh, dest, to_read );
  if ( actually_read != to_read )
    mcpl_error("Error while reading from file");
}